

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void post(QUEUE *q,uv__work_kind kind)

{
  void **ppvStack_10;
  uv__work_kind kind_local;
  QUEUE *q_local;
  
  uv_mutex_lock(&mutex);
  ppvStack_10 = *q;
  if (kind == UV__WORK_SLOW_IO) {
    (*q)[0] = slow_io_pending_wq;
    (*q)[1] = slow_io_pending_wq[1];
    *(QUEUE **)(*q)[1] = q;
    slow_io_pending_wq[1] = q;
    if ((void **)run_slow_work_message[0] != run_slow_work_message) {
      uv_mutex_unlock(&mutex);
      return;
    }
    ppvStack_10 = run_slow_work_message;
  }
  (*(QUEUE *)ppvStack_10)[0] = wq;
  (*(QUEUE *)ppvStack_10)[1] = wq[1];
  *(void ***)(*(QUEUE *)ppvStack_10)[1] = ppvStack_10;
  wq[1] = ppvStack_10;
  if (idle_threads != 0) {
    uv_cond_signal(&cond);
  }
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void post(QUEUE* q, enum uv__work_kind kind) {
  uv_mutex_lock(&mutex);
  if (kind == UV__WORK_SLOW_IO) {
    /* Insert into a separate queue. */
    QUEUE_INSERT_TAIL(&slow_io_pending_wq, q);
    if (!QUEUE_EMPTY(&run_slow_work_message)) {
      /* Running slow I/O tasks is already scheduled => Nothing to do here.
         The worker that runs said other task will schedule this one as well. */
      uv_mutex_unlock(&mutex);
      return;
    }
    q = &run_slow_work_message;
  }

  QUEUE_INSERT_TAIL(&wq, q);
  if (idle_threads > 0)
    uv_cond_signal(&cond);
  uv_mutex_unlock(&mutex);
}